

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O1

rnndelem * copydelem(rnndelem *elem,char *file)

{
  int iVar1;
  rnndelem *prVar2;
  char *pcVar3;
  rnndelem **pprVar4;
  rnndelem *prVar5;
  long lVar6;
  int iVar7;
  bool bVar8;
  
  prVar2 = (rnndelem *)calloc(0x110,1);
  prVar2->type = elem->type;
  pcVar3 = elem->name;
  prVar2->name = pcVar3;
  if (pcVar3 != (char *)0x0) {
    pcVar3 = strdup(pcVar3);
    prVar2->name = pcVar3;
  }
  prVar2->width = elem->width;
  prVar2->access = elem->access;
  prVar2->offset = elem->offset;
  prVar2->length = elem->length;
  prVar2->stride = elem->stride;
  copyvarinfo(&prVar2->varinfo,&elem->varinfo);
  prVar2->file = file;
  copytypeinfo(&prVar2->typeinfo,&elem->typeinfo,file);
  if (0 < elem->subelemsnum) {
    iVar1 = prVar2->subelemsnum;
    iVar7 = prVar2->subelemsmax;
    lVar6 = 0;
    do {
      if ((long)iVar7 <= iVar1 + lVar6) {
        bVar8 = iVar7 == 0;
        iVar7 = iVar7 * 2;
        if (bVar8) {
          iVar7 = 0x10;
        }
        pprVar4 = (rnndelem **)realloc(prVar2->subelems,(long)iVar7 << 3);
        prVar2->subelems = pprVar4;
      }
      prVar5 = copydelem(elem->subelems[lVar6],file);
      prVar2->subelems[iVar1 + lVar6] = prVar5;
      lVar6 = lVar6 + 1;
    } while (lVar6 < elem->subelemsnum);
    prVar2->subelemsnum = iVar1 + (int)lVar6;
    prVar2->subelemsmax = iVar7;
  }
  return prVar2;
}

Assistant:

static struct rnndelem *copydelem (struct rnndelem *elem, char *file) {
	struct rnndelem *res = calloc (sizeof *res, 1);
	res->type = elem->type;
	res->name = elem->name;
	if (res->name)
		res->name = strdup(res->name);
	res->width = elem->width;
	res->access = elem->access;
	res->offset = elem->offset;
	res->length = elem->length;
	res->stride = elem->stride;
	copyvarinfo(&res->varinfo, &elem->varinfo);
	res->file = file;
	copytypeinfo(&res->typeinfo, &elem->typeinfo, file);
	int i;
	for (i = 0; i < elem->subelemsnum; i++)
		ADDARRAY(res->subelems, copydelem(elem->subelems[i], file));
	return res;
}